

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O2

int32 rw::getSizeSkin(void *object,int32 offset,int32 param_3)

{
  int iVar1;
  int iVar2;
  Skin *skin;
  int iVar3;
  int32 iVar4;
  
  if (*(undefined4 **)((long)object + 0x98) != (undefined4 *)0x0) {
    switch(**(undefined4 **)((long)object + 0x98)) {
    case 4:
      iVar4 = ps2::getSizeNativeSkin(object,offset);
      return iVar4;
    case 5:
      iVar4 = xbox::getSizeNativeSkin(object,offset);
      return iVar4;
    case 8:
    case 9:
      return -1;
    case 0xb:
      iVar4 = wdgl::getSizeNativeSkin(object,offset);
      return iVar4;
    }
  }
  skin = *(Skin **)((long)object + (long)offset);
  if (skin == (Skin *)0x0) {
    return -1;
  }
  iVar1 = *(int *)((long)object + 0x1c);
  iVar2 = skin->numBones;
  if (version < 0x34000) {
    iVar3 = iVar2 << 2;
  }
  else {
    iVar3 = skin->numUsedBones;
    iVar4 = skinSplitDataSize(skin);
    iVar3 = iVar4 + iVar3;
  }
  return iVar1 * 0x14 + iVar2 * 0x40 + 4 + iVar3;
}

Assistant:

static int32
getSizeSkin(void *object, int32 offset, int32)
{
	Geometry *geometry = (Geometry*)object;

	if(geometry->instData){
		if(geometry->instData->platform == PLATFORM_PS2)
			return ps2::getSizeNativeSkin(object, offset);
		if(geometry->instData->platform == PLATFORM_WDGL)
			return wdgl::getSizeNativeSkin(object, offset);
		if(geometry->instData->platform == PLATFORM_XBOX)
			return xbox::getSizeNativeSkin(object, offset);
		if(geometry->instData->platform == PLATFORM_D3D8)
			return -1;
		if(geometry->instData->platform == PLATFORM_D3D9)
			return -1;
		assert(0 && "unsupported native skin platform");
	}

	Skin *skin = *PLUGINOFFSET(Skin*, object, offset);
	if(skin == nil)
		return -1;

	int32 size = 4 + geometry->numVertices*(16+4) +
	             skin->numBones*64;
	// not sure which version introduced the new format
	if(version < 0x34000)
		size += skin->numBones*4;
	else
		size += skin->numUsedBones + skinSplitDataSize(skin);
	return size;
}